

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

int __thiscall ncnn::ParamDict::load_param_bin(ParamDict *this,DataReader *dr)

{
  long lVar1;
  long *in_RSI;
  long in_RDI;
  float *ptr;
  int len;
  bool is_array;
  size_t nread;
  int id;
  Allocator *in_stack_ffffffffffffffc8;
  int iVar2;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar3;
  
  clear((ParamDict *)nread);
  iVar3 = 0;
  lVar1 = (**(code **)(*in_RSI + 0x18))(in_RSI,&stack0xffffffffffffffe4,4);
  if (lVar1 == 4) {
    do {
      if (iVar3 == -0xe9) {
        return 0;
      }
      in_stack_ffffffffffffffd4 = CONCAT13(iVar3 < -0x5b03,(int3)in_stack_ffffffffffffffd4);
      if (iVar3 < -0x5b03) {
        iVar3 = -0x5b04 - iVar3;
        iVar2 = 0;
        lVar1 = (**(code **)(*in_RSI + 0x18))(in_RSI,&stack0xffffffffffffffd0,4);
        if (lVar1 != 4) {
          fprintf(_stderr,"ParamDict read array length failed %zd",lVar1);
          fprintf(_stderr,"\n");
          return -1;
        }
        ncnn::Mat::create((Mat *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),0,
                          CONCAT44(in_stack_ffffffffffffffd4,iVar2),in_stack_ffffffffffffffc8);
        in_stack_ffffffffffffffc8 =
             (Allocator *)
             ncnn::Mat::operator_cast_to_float_((Mat *)(in_RDI + (long)iVar3 * 0x48 + 8));
        lVar1 = (**(code **)(*in_RSI + 0x18))(in_RSI,in_stack_ffffffffffffffc8,(long)iVar2 << 2);
        if (lVar1 != (long)iVar2 * 4) {
          fprintf(_stderr,"ParamDict read array element failed %zd",lVar1);
          fprintf(_stderr,"\n");
          return -1;
        }
        *(undefined4 *)(in_RDI + (long)iVar3 * 0x48) = 4;
      }
      else {
        lVar1 = (**(code **)(*in_RSI + 0x18))(in_RSI,in_RDI + (long)iVar3 * 0x48 + 4,4);
        if (lVar1 != 4) {
          fprintf(_stderr,"ParamDict read value failed %zd",lVar1);
          fprintf(_stderr,"\n");
          return -1;
        }
        *(undefined4 *)(in_RDI + (long)iVar3 * 0x48) = 1;
      }
      lVar1 = (**(code **)(*in_RSI + 0x18))(in_RSI,&stack0xffffffffffffffe4,4);
    } while (lVar1 == 4);
    fprintf(_stderr,"ParamDict read EOP failed %zd",lVar1);
    fprintf(_stderr,"\n");
  }
  else {
    fprintf(_stderr,"ParamDict read id failed %zd",lVar1);
    fprintf(_stderr,"\n");
  }
  return -1;
}

Assistant:

int ParamDict::load_param_bin(const DataReader& dr)
{
    clear();

//     binary 0
//     binary 100
//     binary 1
//     binary 1.250000
//     binary 3 | array_bit
//     binary 5
//     binary 0.1
//     binary 0.2
//     binary 0.4
//     binary 0.8
//     binary 1.0
//     binary -233(EOP)

    int id = 0;
    size_t nread;
    nread = dr.read(&id, sizeof(int));
    if (nread != sizeof(int))
    {
        NCNN_LOGE("ParamDict read id failed %zd", nread);
        return -1;
    }

    while (id != -233)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (is_array)
        {
            int len = 0;
            nread = dr.read(&len, sizeof(int));
            if (nread != sizeof(int))
            {
                NCNN_LOGE("ParamDict read array length failed %zd", nread);
                return -1;
            }

            params[id].v.create(len);

            float* ptr = params[id].v;
            nread = dr.read(ptr, sizeof(float) * len);
            if (nread != sizeof(float) * len)
            {
                NCNN_LOGE("ParamDict read array element failed %zd", nread);
                return -1;
            }

            params[id].type = 4;
        }
        else
        {
            nread = dr.read(&params[id].f, sizeof(float));
            if (nread != sizeof(float))
            {
                NCNN_LOGE("ParamDict read value failed %zd", nread);
                return -1;
            }

            params[id].type = 1;
        }

        nread = dr.read(&id, sizeof(int));
        if (nread != sizeof(int))
        {
            NCNN_LOGE("ParamDict read EOP failed %zd", nread);
            return -1;
        }
    }

    return 0;
}